

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidation_tests.cpp
# Opt level: O2

void __thiscall
txvalidation_tests::tx_mempool_reject_coinbase::test_method(tx_mempool_reject_coinbase *this)

{
  long lVar1;
  ChainstateManager *this_00;
  readonly_property<bool> rVar2;
  CScript *pCVar3;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar4;
  unsigned_long uVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  assertion_result *paVar8;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  check_type cVar11;
  uint *puVar9;
  char *pcVar10;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 local_230 [32];
  char *local_210;
  char *local_208;
  uint initialPoolSize;
  char *local_1f8;
  char *local_1f0;
  undefined1 local_1e8 [8];
  bool local_1e0 [8];
  undefined1 *local_1d8;
  pointer local_1d0;
  pointer local_1c8;
  pointer local_1c0;
  char *local_1b8;
  char *local_1b0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  assertion_result local_198;
  MempoolAcceptResult result;
  CMutableTransaction coinbaseTx;
  CScript scriptPubKey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  coinbaseTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  coinbaseTx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  coinbaseTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  coinbaseTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  CKey::GetPubKey((CPubKey *)&result,&(this->super_TestChain100Setup).coinbaseKey);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8,(CPubKey *)&result);
  b._M_extent._M_extent_value = CONCAT71(local_1e0._1_7_,local_1e0[0]) - (long)local_1e8;
  b._M_ptr = (pointer)local_1e8;
  pCVar3 = CScript::operator<<((CScript *)&coinbaseTx,b);
  ppVar4 = &CScript::operator<<(pCVar3,OP_CHECKSIG)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&scriptPubKey.super_CScriptBase,ppVar4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&coinbaseTx);
  CMutableTransaction::CMutableTransaction(&coinbaseTx);
  coinbaseTx.version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&coinbaseTx.vin,1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&coinbaseTx.vout,1);
  result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)0x0;
  result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
  result.m_result_type = VALID;
  result._4_4_ = 0;
  result.m_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
  result.m_state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
  pCVar3 = CScript::operator<<((CScript *)&result,OP_11);
  ppVar4 = &CScript::operator<<(pCVar3,OP_EQUAL)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((coinbaseTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar4);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&result);
  (coinbaseTx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 1000000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((coinbaseTx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             &scriptPubKey.super_CScriptBase);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_1b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1c8,msg);
  CTransaction::CTransaction((CTransaction *)&result,&coinbaseTx);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)CTransaction::IsCoinBase((CTransaction *)&result);
  local_198.m_message.px = (element_type *)0x0;
  local_198.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d0 = (pointer)&criticalblock11;
  criticalblock11.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_130f458;
  criticalblock11.super_unique_lock._8_8_ = (long)"CTransaction(coinbaseTx).IsCoinBase()" + 0x25;
  local_1e0[0] = false;
  local_1e8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_1d8 = boost::unit_test::lazy_ostream::inst;
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_1f0 = "";
  local_198.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_198,(lazy_ostream *)local_1e8,1,0,WARN,_cVar11,(size_t)&local_1f8,0x25);
  boost::detail::shared_count::~shared_count(&local_198.m_message.pn);
  CTransaction::~CTransaction((CTransaction *)&result);
  pvVar6 = (iterator)0x27;
  pvVar7 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock11,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidation_tests.cpp"
             ,0x27,false);
  uVar5 = CTxMemPool::size((this->super_TestChain100Setup).super_TestingSetup.
                           super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
                           super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  initialPoolSize = (uint)uVar5;
  this_00 = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
            super_BasicTestingSetup.m_node.chainman._M_t.
            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
            super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_1e8);
  ChainstateManager::ProcessTransaction(&result,this_00,(CTransactionRef *)local_1e8,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1e0);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_208 = "";
  local_230._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_230._24_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  file_00.m_end = (iterator)0x2c;
  file_00.m_begin = (iterator)&local_210;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)(local_230 + 0x10),msg_00);
  local_198.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(result.m_result_type == INVALID);
  local_198.m_message.px = (element_type *)0x0;
  local_198.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230._0_8_ = "result.m_result_type == MempoolAcceptResult::ResultType::INVALID";
  local_230._8_8_ = "";
  local_1e0[0] = false;
  local_1e8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_1d8 = boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_238 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_1d0 = (pointer)local_230;
  boost::test_tools::tt_detail::report_assertion
            (&local_198,(lazy_ostream *)local_1e8,1,0,WARN,_cVar11,(size_t)&local_240,0x2c);
  boost::detail::shared_count::~shared_count(&local_198.m_message.pn);
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  file_01.m_end = (iterator)0x2f;
  file_01.m_begin = (iterator)&local_250;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_260,
             msg_01);
  local_1e0[0] = false;
  local_1e8 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_1d8 = boost::unit_test::lazy_ostream::inst;
  local_1d0 = (pointer)0xc694e1;
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_268 = "";
  local_198._0_8_ =
       CTxMemPool::size((this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.mempool._M_t.
                        super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                        super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                        super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  paVar8 = &local_198;
  puVar9 = &initialPoolSize;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_1e8,&local_270,0x2f,1,2,paVar8,"m_node.mempool->size()",puVar9,"initialPoolSize")
  ;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)paVar8;
  msg_02.m_begin = pvVar6;
  file_02.m_end = &DAT_00000032;
  file_02.m_begin = (iterator)&local_280;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_290,
             msg_02);
  local_198.m_message.px = (element_type *)0x0;
  local_198.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230._0_8_ = "result.m_state.IsInvalid()";
  local_230._8_8_ = "";
  local_1e0[0] = false;
  local_1e8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_1d8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_298 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_1d0 = (pointer)local_230;
  local_198.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (result.m_state.super_ValidationState<TxValidationResult>.m_mode == M_INVALID);
  boost::test_tools::tt_detail::report_assertion
            (&local_198,(lazy_ostream *)local_1e8,1,0,WARN,(check_type)puVar9,(size_t)&local_2a0,
             0x32);
  boost::detail::shared_count::~shared_count(&local_198.m_message.pn);
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  file_03.m_end = (iterator)0x33;
  file_03.m_begin = (iterator)&local_2b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2c0,
             msg_03);
  local_1e0[0] = false;
  local_1e8 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_1d8 = boost::unit_test::lazy_ostream::inst;
  local_1d0 = (pointer)0xc694e1;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_2c8 = "";
  std::__cxx11::string::string
            ((string *)&local_198,
             &result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason);
  pcVar10 = "coinbase";
  pvVar6 = (iterator)0x2;
  paVar8 = &local_198;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
            (local_1e8,&local_2d0,0x33,1,2,paVar8,"result.m_state.GetRejectReason()","coinbase",
             "\"coinbase\"");
  std::__cxx11::string::~string((string *)&local_198);
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)paVar8;
  msg_04.m_begin = pvVar6;
  file_04.m_end = (iterator)0x34;
  file_04.m_begin = (iterator)&local_2e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2f0,
             msg_04);
  local_198.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (result.m_state.super_ValidationState<TxValidationResult>.m_result == TX_CONSENSUS);
  local_198.m_message.px = (element_type *)0x0;
  local_198.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230._0_8_ = "result.m_state.GetResult() == TxValidationResult::TX_CONSENSUS";
  local_230._8_8_ = "";
  local_1e0[0] = false;
  local_1e8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_1d8 = boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidation_tests.cpp"
  ;
  local_2f8 = "";
  local_1d0 = (pointer)local_230;
  boost::test_tools::tt_detail::report_assertion
            (&local_198,(lazy_ostream *)local_1e8,1,0,WARN,(check_type)pcVar10,(size_t)&local_300,
             0x34);
  boost::detail::shared_count::~shared_count(&local_198.m_message.pn);
  MempoolAcceptResult::~MempoolAcceptResult(&result);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock11.super_unique_lock);
  CMutableTransaction::~CMutableTransaction(&coinbaseTx);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubKey.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(tx_mempool_reject_coinbase, TestChain100Setup)
{
    CScript scriptPubKey = CScript() << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;
    CMutableTransaction coinbaseTx;

    coinbaseTx.version = 1;
    coinbaseTx.vin.resize(1);
    coinbaseTx.vout.resize(1);
    coinbaseTx.vin[0].scriptSig = CScript() << OP_11 << OP_EQUAL;
    coinbaseTx.vout[0].nValue = 1 * CENT;
    coinbaseTx.vout[0].scriptPubKey = scriptPubKey;

    BOOST_CHECK(CTransaction(coinbaseTx).IsCoinBase());

    LOCK(cs_main);

    unsigned int initialPoolSize = m_node.mempool->size();
    const MempoolAcceptResult result = m_node.chainman->ProcessTransaction(MakeTransactionRef(coinbaseTx));

    BOOST_CHECK(result.m_result_type == MempoolAcceptResult::ResultType::INVALID);

    // Check that the transaction hasn't been added to mempool.
    BOOST_CHECK_EQUAL(m_node.mempool->size(), initialPoolSize);

    // Check that the validation state reflects the unsuccessful attempt.
    BOOST_CHECK(result.m_state.IsInvalid());
    BOOST_CHECK_EQUAL(result.m_state.GetRejectReason(), "coinbase");
    BOOST_CHECK(result.m_state.GetResult() == TxValidationResult::TX_CONSENSUS);
}